

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseUpgrader.cpp
# Opt level: O3

json read_json(path *root,string_view path)

{
  runtime_error *this;
  json_value extraout_RDX;
  json jVar1;
  path __result;
  ifstream db_file;
  path local_2b8;
  path local_278;
  basic_string_view<char,_std::char_traits<char>_> local_238;
  long local_228 [4];
  byte abStack_208 [488];
  
  local_238._M_len = (size_t)path._M_str;
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::experimental::filesystem::v1::__cxx11::path>
            (&local_278,&local_238);
  std::experimental::filesystem::v1::__cxx11::path::path(&local_2b8,(path *)path._M_len);
  std::experimental::filesystem::v1::__cxx11::path::_M_append(&local_2b8,&local_278._M_pathname);
  std::ifstream::ifstream(local_228,local_2b8._M_pathname._M_dataplus._M_p,_S_bin);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_2b8);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_278);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
    *(undefined1 *)&(root->_M_pathname)._M_dataplus._M_p = 0;
    (root->_M_pathname)._M_string_length = 0;
    nlohmann::operator>>
              ((istream *)local_228,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)root);
    std::ifstream::~ifstream(local_228);
    jVar1.m_value.object = extraout_RDX.object;
    jVar1._0_8_ = root;
    return jVar1;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Failed to open database file");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

json read_json(const fs::path &root, std::string_view path) {
    std::ifstream db_file(root / path, std::ifstream::binary);

    if (db_file.fail()) {
        throw std::runtime_error("Failed to open database file");
    }

    json db_json;

    try {
        db_file >> db_json;
    } catch (json::parse_error &e) {
        throw std::runtime_error("Failed to parse JSON");
    }
    return db_json;
}